

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3InsertTerms(Fts3Table *p,int iLangid,sqlite3_value **apVal,u32 *aSz)

{
  int iVar1;
  char *zText;
  u32 *pnWord;
  int iCol;
  long lVar2;
  long lVar3;
  bool bVar4;
  int local_3c;
  
  if (p->nColumn < 1) {
    return 0;
  }
  pnWord = aSz;
  lVar2 = 0;
  while( true ) {
    bVar4 = true;
    iVar1 = local_3c;
    if (p->abNotindexed[lVar2] == '\0') {
      zText = (char *)sqlite3ValueText(apVal[lVar2 + 2],'\x01');
      iVar1 = fts3PendingTermsAdd(p,iLangid,zText,(int)lVar2,pnWord);
      bVar4 = iVar1 == 0;
      if (bVar4) {
        iVar1 = sqlite3ValueBytes(apVal[lVar2 + 2],'\x01');
        aSz[p->nColumn] = aSz[p->nColumn] + iVar1;
        iVar1 = local_3c;
      }
    }
    local_3c = iVar1;
    if (!bVar4) break;
    lVar3 = lVar2 + 2;
    pnWord = pnWord + 1;
    lVar2 = lVar2 + 1;
    if (p->nColumn < lVar3) {
      return 0;
    }
  }
  return local_3c;
}

Assistant:

static int fts3InsertTerms(
  Fts3Table *p, 
  int iLangid, 
  sqlite3_value **apVal, 
  u32 *aSz
){
  int i;                          /* Iterator variable */
  for(i=2; i<p->nColumn+2; i++){
    int iCol = i-2;
    if( p->abNotindexed[iCol]==0 ){
      const char *zText = (const char *)sqlite3_value_text(apVal[i]);
      int rc = fts3PendingTermsAdd(p, iLangid, zText, iCol, &aSz[iCol]);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      aSz[p->nColumn] += sqlite3_value_bytes(apVal[i]);
    }
  }
  return SQLITE_OK;
}